

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ThreadState.cpp
# Opt level: O3

ThreadState * axl::spy::getCurrentThreadState(bool createIfNotExists)

{
  size_t slot;
  ThreadState *pTVar1;
  EVP_PKEY_CTX *dst;
  Ptr<axl::spy::ThreadState> newState;
  Ptr<void> local_38;
  Ptr<axl::spy::ThreadState> local_28;
  
  sl::callOnce<axl::sl::ConstructSingleton<axl::sys::TlsMgr>,unsigned_char*>
            (&sl::getSingleton<axl::sys::TlsMgr>(int*)::buffer,0);
  pTVar1 = (ThreadState *)
           sys::TlsMgr::getSlotValuePtr
                     ((TlsMgr *)&sl::getSingleton<axl::sys::TlsMgr>(int*)::buffer,g_threadStateSlot)
  ;
  if (pTVar1 == (ThreadState *)0x0 && createIfNotExists) {
    dst = (EVP_PKEY_CTX *)operator_new(0x40,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(undefined ***)dst = &PTR__ThreadState_0019dfc8;
    *(undefined8 *)(dst + 0x18) = 0;
    *(undefined8 *)(dst + 0x20) = 0;
    *(undefined8 *)(dst + 0x28) = 0;
    *(undefined8 *)(dst + 0x30) = 0;
    *(code **)(dst + 8) = mem::deallocate;
    local_28.m_p = (ThreadState *)0x0;
    local_28.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::spy::ThreadState>::copy(&local_28,dst,dst);
    slot = g_threadStateSlot;
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::Ptr<void>::copy(&local_38,(EVP_PKEY_CTX *)local_28.m_p,(EVP_PKEY_CTX *)local_28.m_refCount);
    sys::TlsMgr::setSlotValue
              ((TlsMgr *)&sl::getSingleton<axl::sys::TlsMgr>(int*)::buffer,slot,&local_38);
    rc::Ptr<void>::clear(&local_38);
    pTVar1 = local_28.m_p;
    rc::Ptr<axl::spy::ThreadState>::clear(&local_28);
  }
  return pTVar1;
}

Assistant:

ThreadState*
getCurrentThreadState(bool createIfNotExists) {
	ASSERT(getCurrentThreadDisableCount() && "thread hooks are not disabled (should be)");

	sys::TlsMgr* tlsMgr = sys::getTlsMgr();
	ThreadState* currentState = (ThreadState*)tlsMgr->getSlotValuePtr(g_threadStateSlot);
	if (currentState || !createIfNotExists)
		return currentState;

	rc::Ptr<ThreadState> newState = AXL_RC_NEW(ThreadState);
	tlsMgr->setSlotValue(g_threadStateSlot, newState);
	return newState;
}